

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O2

uint8_t * bstr_parse_json_string_literal
                    (bstr_context_t *ctx,uint8_t *pBegin,uint8_t *pEnd,adt_str_t *str)

{
  byte bVar1;
  long lVar2;
  byte *pbVar3;
  char cVar4;
  char cVar5;
  int *piVar6;
  long lVar7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  byte *pbVar11;
  uint uVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  uint local_3c;
  
  auVar14._0_4_ = -(uint)(ctx == (bstr_context_t *)0x0);
  auVar14._4_4_ = -(uint)(pBegin == (uint8_t *)0x0);
  auVar14._8_4_ = -(uint)(pEnd == (uint8_t *)0x0);
  auVar14._12_4_ = -(uint)(str == (adt_str_t *)0x0);
  iVar10 = movmskps((int)str,auVar14);
  if (iVar10 == 0 && pBegin <= pEnd) {
    if (pEnd <= pBegin) {
      return pBegin;
    }
    if (*pBegin != '\"') {
      return pBegin;
    }
    bVar8 = false;
    bVar9 = 0;
    local_3c = 0;
    pbVar3 = pBegin + 1;
    cVar4 = '\0';
LAB_001018aa:
    do {
      cVar5 = cVar4;
      pbVar11 = pbVar3;
      if (pEnd <= pbVar11) {
        return pBegin;
      }
      bVar1 = *pbVar11;
      if (bVar8) {
        bVar13 = cVar5 == 'u';
        if (bVar13) {
          if (bVar9 < 4) {
            local_3c = local_3c << 4 | ASCIIHexToInt[bVar1];
            bVar9 = bVar9 + 1;
          }
          uVar12 = local_3c;
          cVar5 = '\0';
          if (bVar9 == 4) {
            bVar9 = 0;
            local_3c = 0;
            goto LAB_0010197b;
          }
          cVar5 = 'u';
          bVar8 = true;
        }
        else {
          bVar8 = true;
          pbVar3 = pbVar11 + 1;
          cVar4 = 'u';
          if (bVar1 == 0x75) goto LAB_001018aa;
          lVar2 = 0;
          do {
            lVar7 = lVar2;
            if (lVar7 == 8) goto LAB_001019b6;
            lVar2 = lVar7 + 1;
          } while (bVar1 != (&DAT_00102000)[lVar7]);
          uVar12 = (uint)(byte)(&DAT_00102008)[lVar7];
LAB_0010197b:
          adt_str_push(str,uVar12);
          bVar8 = bVar13;
        }
        pbVar3 = pbVar11 + 1;
        cVar4 = cVar5;
        goto LAB_001018aa;
      }
      bVar8 = true;
      pbVar3 = pbVar11 + 1;
      cVar4 = cVar5;
      if (bVar1 == 0x5c) goto LAB_001018aa;
      if (bVar1 == 0x22) {
        return pbVar11 + 1;
      }
      if (bVar1 < 0x20) {
LAB_001019b6:
        ctx->lastError = 4;
        return (uint8_t *)0x0;
      }
      cVar5 = adt_str_push(str);
      bVar8 = false;
    } while (cVar5 == '\0');
    ctx->lastError = 5;
  }
  else {
    piVar6 = __errno_location();
    *piVar6 = 0x16;
  }
  return (uint8_t *)0x0;
}

Assistant:

const uint8_t *bstr_parse_json_string_literal(bstr_context_t *ctx, const uint8_t *pBegin, const uint8_t *pEnd, adt_str_t *str)
{
#define NUM_ESCAPE_CHARS 8
   const uint8_t quotationMark = '"';
   const uint8_t backslash = '\\';
   const uint8_t frontslash = '/';
   const uint8_t backspace = '\b';
   const uint8_t formfeed = '\f';
   const uint8_t linefeed = '\n';
   const uint8_t carriageReturn = '\r';
   const uint8_t horizontalTab = '\t';
   const uint8_t validEscapeChars[NUM_ESCAPE_CHARS] = {
         quotationMark,
         backslash,
         frontslash,
         'b',
         'f',
         'n',
         'r',
         't'
   };
   const uint8_t escapeCharMap[NUM_ESCAPE_CHARS] = {
         quotationMark,
         backslash,
         frontslash,
         backspace,
         formfeed,
         linefeed,
         carriageReturn,
         horizontalTab,
   };

   if ( (ctx == 0) || (pBegin == 0) || (pEnd == 0) || (str == 0) || (pEnd < pBegin) )
   {
      errno = EINVAL;
      return (const uint8_t*) 0;
   }
   if (pBegin < pEnd)
   {
      uint8_t firstChar = *pBegin;
      if (firstChar == quotationMark)
      {
         const uint8_t *pNext = pBegin+1;
         bool isEscapeSequence = false;
         uint8_t escapeType = 0u;
         uint8_t numDigits = 0u;
         uint32_t value = 0u;
         while(pNext < pEnd)
         {
            uint8_t c = *pNext++;
            if (isEscapeSequence)
            {
               if (escapeType == 'u')
               {
                  if (numDigits<4)
                  {
                     value<<=4;
                     value|=ASCIIHexToInt[c];
                     numDigits++;
                  }
                  if (numDigits==4)
                  {
                     //TODO: adt_str_push does not yet support unicode, will need to fix that.
                     //TODO: JSON can contain two \u sequences in a row to allow large code points. Will implement that later.
                     adt_str_push(str, (int) value);
                     escapeType = 0u;
                     numDigits = 0u;
                     value = 0u;
                  }
               }
               else
               {
                  if (c == 'u')
                  {
                     escapeType = c;
                  }
                  else
                  {
                     int32_t i;
                     for (i=0; i<NUM_ESCAPE_CHARS; i++)
                     {
                        if (c==validEscapeChars[i])
                        {
                           break;
                        }
                     }
                     if (i < NUM_ESCAPE_CHARS)
                     {
                        adt_str_push(str, escapeCharMap[i]);
                        isEscapeSequence = false;
                     }
                     else
                     {
                        bstr_set_error(ctx, BSTR_INVALID_CHARACTER_ERROR);
                        return (const uint8_t*) 0;
                     }
                  }
               }
            }
            else
            {
               if (c == quotationMark)
               {
                  return pNext;
               }
               else if (c == backslash)
               {
                  isEscapeSequence = true;
               }
               else if (bstr_pred_is_control_char(c))
               {
                  bstr_set_error(ctx, BSTR_INVALID_CHARACTER_ERROR);
                  return (const uint8_t*) 0;
               }
               else
               {
                  adt_error_t result = adt_str_push(str, c);
                  if (result != ADT_NO_ERROR)
                  {
                     bstr_set_error(ctx, BSTR_MEM_ERROR);
                     return (const uint8_t*) 0;
                  }
               }
            }
         }
      }
   }
   return pBegin;
#undef NUM_ESCAPE_CHARS
}